

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_cmp_int(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi Y;
  mbedtls_mpi_sint z_local;
  mbedtls_mpi *X_local;
  
  p[0]._0_4_ = 1;
  if (z < 0) {
    p[0]._0_4_ = 0xffffffff;
  }
  iVar1 = mbedtls_mpi_cmp_mpi(X,(mbedtls_mpi *)p);
  return iVar1;
}

Assistant:

int mbedtls_mpi_cmp_int( const mbedtls_mpi *X, mbedtls_mpi_sint z )
{
    mbedtls_mpi Y;
    mbedtls_mpi_uint p[1];
    MPI_VALIDATE_RET( X != NULL );

    *p  = ( z < 0 ) ? -z : z;
    Y.s = ( z < 0 ) ? -1 : 1;
    Y.n = 1;
    Y.p = p;

    return( mbedtls_mpi_cmp_mpi( X, &Y ) );
}